

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_leaf(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  lysp_node *plVar1;
  LY_ERR LVar2;
  lysp_node *parent_00;
  lysp_node *plVar3;
  lysp_ext_instance **pplVar4;
  char *format;
  ly_stmt parent_stmt;
  lysp_restr **extraout_RDX;
  lysp_restr **restrs;
  lysp_restr **extraout_RDX_00;
  ly_ctx *plVar5;
  lysp_ext_instance *parent_01;
  lysp_ext_instance **exts_00;
  char *pcVar6;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff60;
  ly_stmt in_stack_ffffffffffffff64;
  char *local_98;
  size_t local_90;
  uint16_t *local_88;
  lysp_node **local_80;
  lysp_node *local_78;
  lysp_ext_instance **local_70;
  lysp_qname **local_68;
  lysp_node *local_60;
  lysp_ext_instance **local_58;
  lysp_type *local_50;
  lysp_ext_instance **local_48;
  uint16_t *local_40;
  lysp_ext_instance *local_38;
  
  parent_00 = (lysp_node *)calloc(1,0xd8);
  if (parent_00 == (lysp_node *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar5,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_leaf");
    return LY_EMEM;
  }
  plVar1 = *siblings;
  if (*siblings != (lysp_node *)0x0) {
    do {
      plVar3 = plVar1;
      plVar1 = plVar3->next;
    } while (plVar1 != (lysp_node *)0x0);
    siblings = &plVar3->next;
  }
  *siblings = parent_00;
  parent_00->nodetype = 4;
  parent_00->parent = parent;
  exts_00 = &local_38;
  LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_98,(char **)exts_00,&local_90);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (local_38 == (lysp_ext_instance *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar6 = local_98;
    if (local_90 == 0) {
      pcVar6 = "";
    }
    LVar2 = lydict_insert(plVar5,pcVar6,local_90,&parent_00->name);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = lydict_insert_zc(plVar5,local_98,&parent_00->name);
  }
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  LVar2 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff64,&local_98,&local_90);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (in_stack_ffffffffffffff64 != LY_STMT_SYNTAX_SEMICOLON) {
    if (in_stack_ffffffffffffff64 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = lyplg_ext_stmt2str(in_stack_ffffffffffffff64);
      ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\"."
              ,pcVar6);
      return LY_EVALID;
    }
    LVar2 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff64,&local_98,&local_90);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if (in_stack_ffffffffffffff64 != LY_STMT_SYNTAX_RIGHT_BRACE) {
      exts = &parent_00->exts;
      local_40 = &parent_00[1].nodetype;
      local_48 = &parent_00[2].exts;
      local_50 = (lysp_type *)&parent_00[1].next;
      local_88 = &parent_00->flags;
      local_58 = (lysp_ext_instance **)&parent_00->ref;
      local_60 = parent_00 + 1;
      local_68 = &parent_00->iffeatures;
      local_70 = (lysp_ext_instance **)&parent_00->dsc;
      local_78 = parent_00 + 3;
      local_80 = &parent_00[3].next;
      restrs = extraout_RDX;
      do {
        if ((int)in_stack_ffffffffffffff64 < 0x1d0000) {
          if (0xeffff < (int)in_stack_ffffffffffffff64) {
            if (in_stack_ffffffffffffff64 == LY_STMT_EXTENSION_INSTANCE) {
              exts_00 = (lysp_ext_instance **)0x1000;
              LVar2 = parse_ext(ctx,local_98,local_90,parent_00,LY_STMT_LEAF,0,exts);
            }
            else if (in_stack_ffffffffffffff64 == LY_STMT_IF_FEATURE) {
              LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_68,(yang_arg)exts,exts_00);
            }
            else {
              if (in_stack_ffffffffffffff64 != LY_STMT_MANDATORY) goto LAB_00173347;
              LVar2 = parse_mandatory(ctx,local_88,exts);
            }
            goto LAB_001732b8;
          }
          if (in_stack_ffffffffffffff64 == LY_STMT_CONFIG) {
            LVar2 = parse_config(ctx,local_88,exts);
            goto LAB_001732b8;
          }
          if (in_stack_ffffffffffffff64 != LY_STMT_DEFAULT) {
            if (in_stack_ffffffffffffff64 == LY_STMT_DESCRIPTION) {
              parent_01 = *local_70;
              parent_stmt = LY_STMT_DESCRIPTION;
              pplVar4 = local_70;
              goto LAB_00173256;
            }
LAB_00173347:
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar5 = (ly_ctx *)0x0;
            }
            else {
              plVar5 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar6 = lyplg_ext_stmt2str(in_stack_ffffffffffffff64);
            format = "Invalid keyword \"%s\" as a child of \"%s\".";
            goto LAB_00173336;
          }
          exts_00 = (lysp_ext_instance **)0x2;
          LVar2 = parse_text_field(ctx,local_78,LY_STMT_DEFAULT,(uint32_t)local_78,(char **)0x2,
                                   (yang_arg)local_80,(uint16_t *)exts,
                                   (lysp_ext_instance **)CONCAT44(0x70000,in_stack_ffffffffffffff60)
                                  );
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          *(lyd_node **)&parent_00[3].nodetype =
               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        else {
          if ((int)in_stack_ffffffffffffff64 < 0x2e0000) {
            if (in_stack_ffffffffffffff64 == LY_STMT_MUST) {
              LVar2 = parse_restrs(ctx,(ly_stmt)local_60,restrs);
            }
            else if (in_stack_ffffffffffffff64 == LY_STMT_REFERENCE) {
              parent_01 = *local_58;
              parent_stmt = LY_STMT_REFERENCE;
              pplVar4 = local_58;
LAB_00173256:
              exts_00 = (lysp_ext_instance **)0x2;
              LVar2 = parse_text_field(ctx,parent_01,parent_stmt,(uint32_t)pplVar4,(char **)0x2,
                                       Y_IDENTIF_ARG,(uint16_t *)exts,
                                       (lysp_ext_instance **)
                                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                      );
            }
            else {
              if (in_stack_ffffffffffffff64 != LY_STMT_STATUS) goto LAB_00173347;
              LVar2 = parse_status(ctx,local_88,exts);
            }
          }
          else if (in_stack_ffffffffffffff64 == LY_STMT_TYPE) {
            LVar2 = parse_type(ctx,local_50);
          }
          else {
            if (in_stack_ffffffffffffff64 == LY_STMT_UNITS) {
              parent_01 = *local_48;
              parent_stmt = LY_STMT_UNITS;
              pplVar4 = local_48;
              goto LAB_00173256;
            }
            if (in_stack_ffffffffffffff64 != LY_STMT_WHEN) goto LAB_00173347;
            LVar2 = parse_when(ctx,(lysp_when **)local_40);
          }
LAB_001732b8:
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
        }
        LVar2 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff64,&local_98,&local_90);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        restrs = extraout_RDX_00;
      } while (in_stack_ffffffffffffff64 != LY_STMT_SYNTAX_RIGHT_BRACE);
      if ((*exts != (lysp_ext_instance *)0x0) &&
         (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
         LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
    }
  }
  if (parent_00[1].next != (lysp_node *)0x0) {
    return LY_SUCCESS;
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar5 = (ly_ctx *)0x0;
  }
  else {
    plVar5 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
  pcVar6 = "type";
LAB_00173336:
  ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"leaf");
  return LY_EVALID;
}

Assistant:

LY_ERR
parse_leaf(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_leaf *leaf;

    /* create new leaf structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, leaf, next, LY_EMEM);
    leaf->nodetype = LYS_LEAF;
    leaf->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, leaf->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_text_field(ctx, &leaf->dflt, LY_STMT_DEFAULT, 0, &leaf->dflt.str, Y_STR_ARG,
                    &leaf->dflt.flags, &leaf->exts));
            leaf->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, leaf->dsc, LY_STMT_DESCRIPTION, 0, &leaf->dsc, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &leaf->iffeatures, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &leaf->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, leaf->ref, LY_STMT_REFERENCE, 0, &leaf->ref, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &leaf->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, leaf->units, LY_STMT_UNITS, 0, &leaf->units, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &leaf->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, leaf, LY_STMT_LEAF, 0, &leaf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "leaf");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, leaf->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!leaf->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf");
        return LY_EVALID;
    }

cleanup:
    return ret;
}